

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O3

int need_value(FuncState *fs,int list)

{
  byte bVar1;
  Instruction *pIVar2;
  uint uVar3;
  long lVar4;
  
  if (list != -1) {
    pIVar2 = fs->f->code;
    do {
      lVar4 = (long)list;
      if ((list < 1) || (bVar1 = (byte)pIVar2[lVar4 + -1], -1 < (char)luaP_opmodes[bVar1])) {
        bVar1 = (byte)pIVar2[lVar4];
      }
      if (bVar1 != 0x23) {
        return 1;
      }
      uVar3 = (uint)*(ushort *)((long)pIVar2 + lVar4 * 4 + 2);
    } while ((uVar3 != 0x7fff) && (list = list + -0x7fff + uVar3, list != -1));
  }
  return 0;
}

Assistant:

static int need_value (FuncState *fs, int list) {
  for (; list != NO_JUMP; list = getjump(fs, list)) {
    Instruction i = *getjumpcontrol(fs, list);
    if (GET_OPCODE(i) != OP_TESTSET) return 1;
  }
  return 0;  /* not found */
}